

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O0

string * __thiscall
program_options::option_description::canonical_display_name_abi_cxx11_
          (option_description *this,int prefix_style)

{
  bool bVar1;
  long lVar2;
  reference pbVar3;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  char cVar4;
  string *this_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  allocator<char> local_81;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  allocator<char> local_49;
  string local_48 [32];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  int local_14;
  
  cVar4 = (char)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  this_00 = in_RDI;
  local_14 = in_EDX;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI);
  if (!bVar1) {
    if (local_14 == 1) {
      local_20._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_ffffffffffffff48);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_20);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      return this_00;
    }
    if (local_14 == 0x1000) {
      local_28._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_ffffffffffffff48);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_28);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      return this_00;
    }
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 2) {
    if (local_14 == 8) {
      cVar4 = (char)((ulong)&local_49 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::__cxx11::string::operator[]((ulong)in_RSI);
      std::operator+(in_RDI,cVar4);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
      return this_00;
    }
    if (local_14 == 4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::__cxx11::string::operator[]((ulong)in_RSI);
      std::operator+(in_RDI,cVar4);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      std::allocator<char>::~allocator(&local_81);
      return this_00;
    }
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
  if (bVar1) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    local_90._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffff48);
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_90);
    std::__cxx11::string::string((string *)in_RDI,(string *)pbVar3);
  }
  return this_00;
}

Assistant:

std::string option_description::canonical_display_name(int prefix_style) const
{
    // We prefer the first long name over any others
    if (!m_long_names.empty())
    {
        if (prefix_style == command_line_style::allow_long)
            return "--" + *m_long_names.begin();
        if (prefix_style == command_line_style::allow_long_disguise)
            return "-" + *m_long_names.begin();
    }
    // sanity check: m_short_name[0] should be '-' or '/'
    if (m_short_name.length() == 2)
    {
        if (prefix_style == command_line_style::allow_slash_for_short)
            return std::string("/") + m_short_name[1];
        if (prefix_style == command_line_style::allow_dash_for_short)
            return std::string("-") + m_short_name[1];
    }
    if (!m_long_names.empty())
        return *m_long_names.begin();
    else
        return m_short_name;
}